

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O0

Aig_Obj_t * Csw_ObjTwoVarCut(Csw_Man_t *p,Csw_Cut_t *pCut)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  Aig_Obj_t *p_00;
  Aig_Obj_t *p_01;
  uint *puVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  int local_3c;
  uint local_38;
  int fCompl;
  int uTruth;
  int nVars;
  Aig_Obj_t *pIn1;
  Aig_Obj_t *pIn0;
  Aig_Obj_t *pRes;
  Csw_Cut_t *pCut_local;
  Csw_Man_t *p_local;
  
  local_3c = 0;
  if (pCut->nFanins < '\x03') {
    __assert_fail("pCut->nFanins > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/csw/cswCut.c"
                  ,0x19d,"Aig_Obj_t *Csw_ObjTwoVarCut(Csw_Man_t *, Csw_Cut_t *)");
  }
  iVar2 = Csw_CutSupportMinimize(p,pCut);
  if (iVar2 == 2) {
    p_00 = Aig_ManObj(p->pManRes,*(int *)&pCut[1].pNext);
    p_01 = Aig_ManObj(p->pManRes,*(int *)((long)&pCut[1].pNext + 4));
    puVar3 = Csw_CutTruth(pCut);
    local_38 = *puVar3 & 0xf;
    if ((((local_38 == 0xe) || (local_38 == 0xd)) || (local_38 == 0xb)) || (local_38 == 7)) {
      local_38 = (local_38 ^ 0xffffffff) & 0xf;
      local_3c = 1;
    }
    pIn0 = (Aig_Obj_t *)0x0;
    if (local_38 == 1) {
      pAVar1 = p->pManRes;
      pAVar4 = Aig_Not(p_00);
      p1 = Aig_Not(p_01);
      pIn0 = Aig_And(pAVar1,pAVar4,p1);
    }
    if (local_38 == 2) {
      pAVar1 = p->pManRes;
      pAVar4 = Aig_Not(p_01);
      pIn0 = Aig_And(pAVar1,p_00,pAVar4);
    }
    if (local_38 == 4) {
      pAVar1 = p->pManRes;
      pAVar4 = Aig_Not(p_00);
      pIn0 = Aig_And(pAVar1,pAVar4,p_01);
    }
    if (local_38 == 8) {
      pIn0 = Aig_And(p->pManRes,p_00,p_01);
    }
    if (pIn0 != (Aig_Obj_t *)0x0) {
      pIn0 = Aig_NotCond(pIn0,local_3c);
    }
    return pIn0;
  }
  __assert_fail("nVars == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/csw/cswCut.c"
                ,0x1a0,"Aig_Obj_t *Csw_ObjTwoVarCut(Csw_Man_t *, Csw_Cut_t *)");
}

Assistant:

Aig_Obj_t * Csw_ObjTwoVarCut( Csw_Man_t * p, Csw_Cut_t * pCut )
{
    Aig_Obj_t * pRes, * pIn0, * pIn1;
    int nVars, uTruth, fCompl = 0;
    assert( pCut->nFanins > 2 );
    // minimize support of this cut
    nVars = Csw_CutSupportMinimize( p, pCut );
    assert( nVars == 2 );
    // get the fanins
    pIn0 = Aig_ManObj( p->pManRes, pCut->pFanins[0] );
    pIn1 = Aig_ManObj( p->pManRes, pCut->pFanins[1] );
    // derive the truth table
    uTruth = 0xF & *Csw_CutTruth(pCut);
    if ( uTruth == 14 || uTruth == 13 || uTruth == 11 || uTruth == 7 )
    {
        uTruth = 0xF & ~uTruth;
        fCompl = 1;
    }
    // compute the result
    pRes = NULL;
    if ( uTruth == 1  )  // 0001  // 1110  14
        pRes = Aig_And( p->pManRes, Aig_Not(pIn0), Aig_Not(pIn1) );
    if ( uTruth == 2  )  // 0010  // 1101  13 
        pRes = Aig_And( p->pManRes,         pIn0 , Aig_Not(pIn1) );
    if ( uTruth == 4  )  // 0100  // 1011  11
        pRes = Aig_And( p->pManRes, Aig_Not(pIn0),         pIn1  );
    if ( uTruth == 8  )  // 1000  // 0111   7
        pRes = Aig_And( p->pManRes,         pIn0 ,         pIn1  );
    if ( pRes )
        pRes = Aig_NotCond( pRes, fCompl );
    return pRes;
}